

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O1

int run_test_pipe_connect_multiple(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  int iVar3;
  client_t *pcVar4;
  uv_pipe_t *handle;
  uv_pipe_t *puVar5;
  uv_loop_t *loop;
  long lVar6;
  client_t *handle_00;
  
  puVar2 = uv_default_loop();
  iVar3 = 0x327af0;
  puVar5 = (uv_pipe_t *)puVar2;
  iVar1 = uv_pipe_init(puVar2,&server_handle,0);
  if (iVar1 == 0) {
    puVar5 = &server_handle;
    iVar3 = 0x18e322;
    iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_00162c74;
    puVar5 = &server_handle;
    iVar3 = 0x80;
    iVar1 = uv_listen((uv_stream_t *)&server_handle,0x80,connection_cb);
    if (iVar1 != 0) goto LAB_00162c79;
    handle_00 = clients;
    lVar6 = 4;
    do {
      pcVar4 = handle_00;
      puVar5 = (uv_pipe_t *)puVar2;
      iVar1 = uv_pipe_init(puVar2,&handle_00->pipe_handle,0);
      iVar3 = (int)pcVar4;
      if (iVar1 != 0) {
        run_test_pipe_connect_multiple_cold_4();
        goto LAB_00162c6f;
      }
      uv_pipe_connect(&handle_00->conn_req,&handle_00->pipe_handle,"/tmp/uv-test-sock",connect_cb);
      handle_00 = handle_00 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    iVar3 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (connection_cb_called != 4) goto LAB_00162c7e;
    if (connect_cb_called != 4) goto LAB_00162c83;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    iVar3 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_00162c6f:
    run_test_pipe_connect_multiple_cold_1();
LAB_00162c74:
    run_test_pipe_connect_multiple_cold_2();
LAB_00162c79:
    puVar2 = (uv_loop_t *)puVar5;
    run_test_pipe_connect_multiple_cold_3();
LAB_00162c7e:
    run_test_pipe_connect_multiple_cold_5();
LAB_00162c83:
    run_test_pipe_connect_multiple_cold_6();
  }
  run_test_pipe_connect_multiple_cold_7();
  if (iVar3 == 0) {
    handle = connections + connection_cb_called;
    loop = *(uv_loop_t **)&puVar2->active_handles;
    puVar5 = handle;
    iVar1 = uv_pipe_init(loop,handle,0);
    iVar3 = (int)puVar5;
    if (iVar1 == 0) {
      loop = puVar2;
      iVar1 = uv_accept((uv_stream_t *)puVar2,(uv_stream_t *)handle);
      iVar3 = (int)handle;
      if (iVar1 == 0) {
        connection_cb_called = connection_cb_called + 1;
        if ((connection_cb_called == 4) && (connect_cb_called == 4)) {
          uv_stop(*(uv_loop_t **)&puVar2->active_handles);
          return extraout_EAX;
        }
        return connection_cb_called;
      }
      goto LAB_00162d13;
    }
  }
  else {
    connection_cb_cold_1();
    loop = puVar2;
  }
  connection_cb_cold_2();
LAB_00162d13:
  connection_cb_cold_3();
  if (iVar3 != 0) {
    connect_cb_cold_1();
    iVar1 = uv_is_closing((uv_handle_t *)loop);
    if (iVar1 != 0) {
      return iVar1;
    }
    uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
    return extraout_EAX_01;
  }
  connect_cb_called = connect_cb_called + 1;
  if ((connect_cb_called == 4) && (connection_cb_called == 4)) {
    uv_stop(*(uv_loop_t **)((long)loop->pending_queue[0] + 8));
    return extraout_EAX_00;
  }
  return connect_cb_called;
}

Assistant:

TEST_IMPL(pipe_connect_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT(r == 0);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb);
  ASSERT(r == 0);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT(r == 0);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb);
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(connection_cb_called == NUM_CLIENTS);
  ASSERT(connect_cb_called == NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY();
  return 0;
}